

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  string *__rhs;
  short sVar1;
  size_type sVar2;
  cmState *pcVar3;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  __last;
  char cVar4;
  _Bool _Var5;
  FIELD *pFVar6;
  long *plVar7;
  long lVar8;
  cmCursesLongMessageForm *pcVar9;
  char *pcVar10;
  size_t sVar11;
  char *__s;
  long *plVar12;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  _Var13;
  FIELD **ppFVar14;
  int iVar15;
  uint uVar16;
  FORM *pFVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *messages;
  uint uVar18;
  string searchstr;
  int key;
  char debugMessage [128];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  FIELD *local_118;
  uint local_10c;
  allocator<char> local_105;
  uint local_104;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_100;
  string local_f8;
  size_t local_d8;
  FIELD *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  string *local_c0;
  char local_b8 [136];
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    __rhs = &this->SearchString;
    local_c0 = (string *)&this->OldSearchString;
    local_c8 = &this->Errors;
    messages = &this->HelpMessage;
    uVar18 = 0;
    local_100 = messages;
LAB_00140146:
    do {
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
      PrintKeys(this,0);
      if (this->SearchMode == true) {
        std::operator+(&local_138,"Search: ",__rhs);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,local_138._M_dataplus._M_p);
        PrintKeys(this,1);
        move(uVar18 - 5);
        if (_stdscr == 0) {
          iVar15 = -1;
        }
        else {
          iVar15 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar15,1);
        refresh();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
      }
      local_10c = wgetch(_stdscr);
      if (_stdscr != 0) {
        sVar1 = *(short *)(_stdscr + 6);
        uVar18 = (int)*(short *)(_stdscr + 4) + 1;
        if (*(short *)(_stdscr + 4) < 5 || sVar1 < 0x40) goto LAB_0014028f;
        pFVar6 = current_field((this->super_cmCursesForm).Form);
        plVar7 = (long *)field_userptr(pFVar6);
        if (this->SearchMode != true) {
          if ((plVar7 == (long *)0x0) ||
             (cVar4 = (**(code **)(*plVar7 + 0x10))(plVar7,&local_10c,this,_stdscr), cVar4 == '\0'))
          goto LAB_00140335;
          this->OkToGenerate = false;
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
          PrintKeys(this,0);
          goto switchD_00140395_caseD_65;
        }
        if ((local_10c == 0x157) || (local_10c == 10)) {
          this->SearchMode = false;
          if ((this->SearchString)._M_string_length == 0) {
            pcVar10 = (char *)0x0;
          }
          else {
            JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
            std::__cxx11::string::_M_assign(local_c0);
            pcVar10 = (char *)(this->SearchString)._M_string_length;
          }
          std::__cxx11::string::_M_replace((ulong)__rhs,0,pcVar10,0x4b446e);
        }
        else if (((local_10c & 0xffffffdf) - 0x41 < 0x1a) ||
                (local_10c == 0x5f || local_10c - 0x30 < 10)) {
          if ((this->SearchString)._M_string_length < (ulong)(ushort)(sVar1 - 9)) {
            std::__cxx11::string::push_back((char)__rhs);
          }
        }
        else if ((((local_10c == 8) || (local_10c == 0x14a)) || (local_10c == 0x107)) &&
                (sVar2 = (this->SearchString)._M_string_length, sVar2 != 0)) {
          std::__cxx11::string::resize((ulong)__rhs,(char)sVar2 + -1);
        }
LAB_00140335:
        if (this->SearchMode != false) goto switchD_00140395_caseD_65;
        sprintf(local_b8,"Main form handling input, key: %d",(ulong)local_10c);
        cmCursesForm::LogMessage(local_b8);
        if (0x62 < (int)local_10c) {
          if (0x101 < (int)local_10c) {
            if ((int)local_10c < 0x152) {
              if (local_10c == 0x102) goto switchD_00140395_caseD_6a;
              if (local_10c == 0x103) goto switchD_00140395_caseD_6b;
            }
            else {
              if (local_10c == 0x152) goto LAB_001404ea;
              if (local_10c == 0x153) goto LAB_001404dc;
            }
            goto switchD_00140395_caseD_65;
          }
          switch(local_10c) {
          case 99:
            Configure(this,0);
            break;
          case 100:
            if (this->NumberOfVisibleEntries != 0) {
              this->OkToGenerate = false;
              pFVar6 = current_field((this->super_cmCursesForm).Form);
              iVar15 = field_index(pFVar6);
              lVar8 = (long)iVar15;
              if (iVar15 == 2) {
                ppFVar14 = this->Fields;
                local_118 = (FIELD *)0x0;
              }
              else {
                ppFVar14 = this->Fields;
                if (this->NumberOfVisibleEntries * 3 + -1 == lVar8) {
                  local_118 = ppFVar14[lVar8 + -5];
                }
                else {
                  local_118 = ppFVar14[lVar8 + 1];
                }
              }
              plVar7 = (long *)field_userptr(ppFVar14[lVar8 + -2]);
              if (plVar7 != (long *)0x0) {
                pcVar3 = this->CMakeInstance->State;
                pcVar10 = (char *)(**(code **)(*plVar7 + 0x28))(plVar7);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_138,pcVar10,(allocator<char> *)&local_f8);
                cmState::RemoveCacheEntry(pcVar3,&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                           local_138.field_2._M_local_buf[0]) + 1);
                }
                local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                local_138._M_string_length = 0;
                local_138.field_2._M_local_buf[0] = '\0';
                if (local_118 != (FIELD *)0x0) {
                  plVar12 = (long *)field_userptr(local_118);
                  pcVar10 = (char *)(**(code **)(*plVar12 + 0x28))(plVar12);
                  std::__cxx11::string::operator=((string *)&local_138,pcVar10);
                }
                if (_stdscr == 0) {
                  uVar18 = 0xffffffff;
                  uVar16 = 0xffffffff;
                }
                else {
                  uVar18 = (int)*(short *)(_stdscr + 4) + 1;
                  uVar16 = (int)*(short *)(_stdscr + 6) + 1;
                }
                pcVar10 = (char *)(**(code **)(*plVar7 + 0x28))(plVar7);
                RemoveEntry(this,pcVar10);
                RePost(this);
                (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                          (this,1,1,(ulong)uVar16,(ulong)uVar18);
                if ((local_118 != (FIELD *)0x0) &&
                   (__last._M_current =
                         (this->Entries->
                         super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish,
                   _Var13 = std::
                            find_if<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite**,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>,cmCursesMainForm::HandleInput()::__0>
                                      ((__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                        )(this->Entries->
                                         super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start,__last,
                                       &local_138), _Var13._M_current != __last._M_current)) {
                  set_current_field((this->super_cmCursesForm).Form,
                                    (*_Var13._M_current)->Entry->Field);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_138._M_dataplus._M_p != &local_138.field_2) {
                  operator_delete(local_138._M_dataplus._M_p,
                                  CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                           local_138.field_2._M_local_buf[0]) + 1);
                }
              }
            }
            break;
          case 0x67:
            if (this->OkToGenerate == true) {
              Generate(this);
              return;
            }
            break;
          case 0x68:
            if (_stdscr == 0) {
              uVar18 = 0xffffffff;
              local_104 = 0xffffffff;
            }
            else {
              uVar18 = (int)*(short *)(_stdscr + 4) + 1;
              local_104 = (int)*(short *)(_stdscr + 6) + 1;
            }
            local_d0 = current_field((this->super_cmCursesForm).Form);
            iVar15 = field_index(local_d0);
            plVar7 = (long *)field_userptr(this->Fields[(long)iVar15 + -2]);
            local_118 = (FIELD *)(**(code **)(*plVar7 + 0x28))(plVar7);
            pcVar3 = this->CMakeInstance->State;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,(char *)local_118,(allocator<char> *)&local_f8);
            pcVar10 = cmState::GetCacheEntryValue(pcVar3,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                       local_138.field_2._M_local_buf[0]) + 1);
            }
            if (pcVar10 == (char *)0x0) {
LAB_0014083c:
              std::__cxx11::string::operator=
                        ((string *)
                         ((messages->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1),"");
            }
            else {
              pcVar3 = this->CMakeInstance->State;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_138,(char *)local_118,&local_105);
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"HELPSTRING","");
              pcVar10 = cmState::GetCacheEntryProperty(pcVar3,&local_138,&local_f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                         local_138.field_2._M_local_buf[0]) + 1);
              }
              if (pcVar10 == (char *)0x0) goto LAB_0014083c;
              local_d8 = strlen((char *)local_118);
              sVar11 = strlen(pcVar10);
              __s = (char *)operator_new__(local_d8 + sVar11 + 0x40);
              sprintf(__s,"Current option is: %s\nHelp string for this option is: %s\n",local_118,
                      pcVar10);
              std::__cxx11::string::operator=
                        ((string *)
                         ((messages->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1),__s);
              operator_delete__(__s);
            }
            pcVar9 = (cmCursesLongMessageForm *)operator_new(0x60);
            cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar9,messages,"Help.");
            uVar16 = local_104;
            cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
            (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])
                      (pcVar9,1,1,(ulong)local_104,(ulong)uVar18);
            (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
            cmCursesForm::CurrentForm = &this->super_cmCursesForm;
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                      (this,1,1,(ulong)uVar16,(ulong)uVar18);
            pFVar17 = (this->super_cmCursesForm).Form;
            pFVar6 = local_d0;
LAB_001408ce:
            set_current_field(pFVar17,pFVar6);
            break;
          case 0x6a:
switchD_00140395_caseD_6a:
            pFVar6 = current_field((this->super_cmCursesForm).Form);
            iVar15 = field_index(pFVar6);
            if (this->NumberOfVisibleEntries * 3 + -1 != (long)iVar15) {
              _Var5 = new_page(this->Fields[(long)iVar15 + 1]);
              pFVar17 = (this->super_cmCursesForm).Form;
              if (!_Var5) {
                iVar15 = 0x204;
                goto LAB_00140618;
              }
              goto LAB_001404ee;
            }
            goto LAB_00140146;
          case 0x6b:
            goto switchD_00140395_caseD_6b;
          case 0x6c:
            if (_stdscr == 0) {
              uVar18 = 0xffffffff;
              uVar16 = 0xffffffff;
            }
            else {
              uVar18 = (int)*(short *)(_stdscr + 4) + 1;
              uVar16 = (int)*(short *)(_stdscr + 6) + 1;
            }
            pcVar9 = (cmCursesLongMessageForm *)operator_new(0x60);
            cmCursesLongMessageForm::cmCursesLongMessageForm
                      (pcVar9,local_c8,"Errors occurred during the last pass.");
            cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
            (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])
                      (pcVar9,1,1,(ulong)uVar16,(ulong)uVar18);
            (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
            cmCursesForm::CurrentForm = &this->super_cmCursesForm;
            goto LAB_0014069a;
          case 0x6e:
            if ((this->OldSearchString)._M_string_length != 0) {
              JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
            }
            break;
          case 0x71:
            goto switchD_00140395_caseD_71;
          case 0x74:
            this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
            if (_stdscr == 0) {
              uVar18 = 0xffffffff;
              uVar16 = 0xffffffff;
            }
            else {
              uVar18 = (int)*(short *)(_stdscr + 4) + 1;
              uVar16 = (int)*(short *)(_stdscr + 6) + 1;
            }
            RePost(this);
LAB_0014069a:
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                      (this,1,1,(ulong)uVar16,(ulong)uVar18);
          }
switchD_00140395_caseD_65:
          messages = local_100;
          if (_stdscr == 0) {
            iVar15 = -1;
          }
          else {
            iVar15 = *(short *)(_stdscr + 4) + 1;
          }
          wtouchln(_stdscr,0,iVar15,1);
          wrefresh(_stdscr);
          goto LAB_00140146;
        }
        if ((int)local_10c < 0x10) {
          if (local_10c != 4) {
            if (local_10c == 0xe) goto switchD_00140395_caseD_6a;
            goto switchD_00140395_caseD_65;
          }
LAB_001404ea:
          pFVar17 = (this->super_cmCursesForm).Form;
LAB_001404ee:
          iVar15 = 0x200;
        }
        else if (local_10c == 0x10) {
switchD_00140395_caseD_6b:
          pFVar6 = current_field((this->super_cmCursesForm).Form);
          iVar15 = field_index(pFVar6);
          if (iVar15 == 2) goto LAB_00140146;
          _Var5 = new_page(this->Fields[(long)iVar15 + -2]);
          pFVar17 = (this->super_cmCursesForm).Form;
          if (_Var5) {
            form_driver(pFVar17,0x201);
            pFVar17 = (this->super_cmCursesForm).Form;
            pFVar6 = this->Fields[(long)iVar15 + -3];
            goto LAB_001408ce;
          }
          iVar15 = 0x205;
        }
        else {
          if (local_10c != 0x15) {
            if (local_10c == 0x2f) {
              this->SearchMode = true;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
              PrintKeys(this,1);
              if (_stdscr == 0) {
                iVar15 = -1;
              }
              else {
                iVar15 = *(short *)(_stdscr + 4) + 1;
              }
              wtouchln(_stdscr,0,iVar15,1);
              refresh();
            }
            goto switchD_00140395_caseD_65;
          }
LAB_001404dc:
          pFVar17 = (this->super_cmCursesForm).Form;
          iVar15 = 0x201;
        }
LAB_00140618:
        form_driver(pFVar17,iVar15);
        goto switchD_00140395_caseD_65;
      }
      uVar18 = 0xffffffff;
LAB_0014028f:
    } while (local_10c != 0x71);
  }
switchD_00140395_caseD_71:
  return;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0, y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr.c_str());
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString = "";
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.resize(this->SearchString.size() - 1);
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        const char* helpString = nullptr;

        const char* existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          char* message = new char
            [strlen(curField) + strlen(helpString) +
             strlen(
               "Current option is: \n Help string for this option is: \n") +
             10];
          sprintf(
            message,
            "Current option is: %s\nHelp string for this option is: %s\n",
            curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs =
          new cmCursesLongMessageForm(this->HelpMessage, "Help.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Errors, "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        if (this->AdvancedMode) {
          this->AdvancedMode = false;
        } else {
          this->AdvancedMode = true;
        }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt =
              std::find_if(this->Entries->begin(), this->Entries->end(),
                           [&nextVal](cmCursesCacheEntryComposite* entry) {
                             return nextVal == entry->Key;
                           });

            if (nextEntryIt != this->Entries->end()) {
              set_current_field(this->Form, (*nextEntryIt)->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}